

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

string * __thiscall OpenMD::StringTokenizer::nextToken_abi_cxx11_(StringTokenizer *this)

{
  bool bVar1;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *piVar2;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  insertIter;
  string *result;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  StringTokenizer *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar3;
  value_type *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar4;
  bool local_71;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [3];
  char *local_30;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff40,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if (bVar1) {
    local_30 = (char *)std::__cxx11::string::begin();
    std::
    insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::insert_iterator(&local_28,in_RDI,(_Iter)local_30);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      local_71 = false;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(in_RSI + 0x48));
        local_71 = isDelimiter(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      }
      if (local_71 == false) {
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_ffffffffffffff40,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
          bVar4 = 0;
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(in_RSI + 0x48));
            bVar1 = isDelimiter(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
            bVar4 = bVar1 ^ 0xff;
          }
          if ((bVar4 & 1) == 0) break;
          iVar3 = 0;
          local_58[0] = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(ulong)in_stack_ffffffffffffff48,
                                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(local_58);
          piVar2 = std::
                   insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_28,iVar3);
          in_stack_ffffffffffffff40 =
               (StringTokenizer *)
               std::
               insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(piVar2);
          std::
          insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT17(bVar4,in_stack_ffffffffffffff60),(value_type *)piVar2);
        }
        return in_RDI;
      }
      if ((*(byte *)(in_RSI + 0x40) & 1) != 0) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(in_RSI + 0x48));
    }
    local_48[0] = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(local_48);
    piVar2 = std::
             insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator++(&local_28,0);
    std::
    insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(piVar2);
    std::
    insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

std::string StringTokenizer::nextToken() {
    std::string result;

    if (currentPos_ != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (currentPos_ != end_ && isDelimiter(*currentPos_)) {
        if (returnTokens_) {
          *insertIter++ = *currentPos_++;
          return result;
        }

        ++currentPos_;
      }

      while (currentPos_ != end_ && !isDelimiter(*currentPos_)) {
        *insertIter++ = *currentPos_++;
      }
    }

    return result;
  }